

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

void __thiscall SQTable::AllocNodes(SQTable *this,SQInteger nSize)

{
  _HashNode *p_Var1;
  SQObjectValue *pSVar2;
  SQInteger SVar3;
  
  p_Var1 = (_HashNode *)sq_vm_malloc(nSize * 0x28);
  if (0 < nSize) {
    pSVar2 = &(p_Var1->key).super_SQObject._unVal;
    SVar3 = nSize;
    do {
      pSVar2[-2].pTable = (SQTable *)0x0;
      pSVar2[-3].fFloat = 2.350989e-38;
      ((SQObject *)(pSVar2 + -1))->_type = OT_NULL;
      pSVar2->pTable = (SQTable *)0x0;
      pSVar2[1].pTable = (SQTable *)0x0;
      pSVar2 = pSVar2 + 5;
      SVar3 = SVar3 + -1;
    } while (SVar3 != 0);
  }
  this->_numofnodes = nSize;
  this->_nodes = p_Var1;
  this->_firstfree = p_Var1 + nSize + -1;
  return;
}

Assistant:

void SQTable::AllocNodes(SQInteger nSize)
{
    _HashNode *nodes=(_HashNode *)SQ_MALLOC(sizeof(_HashNode)*nSize);
    for(SQInteger i=0;i<nSize;i++){
        _HashNode &n = nodes[i];
        new (&n) _HashNode;
        n.next=NULL;
    }
    _numofnodes=nSize;
    _nodes=nodes;
    _firstfree=&_nodes[_numofnodes-1];
}